

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint_sub.c
# Opt level: O0

int main(void)

{
  int iVar1;
  _PDCLIB_bigint_t *lhs_00;
  _PDCLIB_bigint_digit_t MAX;
  _PDCLIB_bigint_digit_t LRG;
  _PDCLIB_bigint_digit_t MID;
  _PDCLIB_bigint_digit_t SML;
  _PDCLIB_bigint_digit_t NUL;
  _PDCLIB_bigint_t res;
  _PDCLIB_bigint_t rhs;
  _PDCLIB_bigint_t lhs;
  
  rhs.size._0_2_ = 0xffff;
  res.size._0_2_ = 0x8000;
  LRG = 0x7fff;
  rhs.size._2_2_ = 0;
  res.size._2_2_ = 0;
  MID = 0;
  rhs.size._4_2_ = 0;
  res.size._4_2_ = 0x8001;
  SML = 0x7fff;
  rhs.size._6_2_ = 0;
  res.size._6_2_ = 0;
  NUL = 0xffff;
  rhs.data[0] = 0xffff;
  res.data[0] = 0;
  rhs.data[1] = 0x8000;
  res.data[1] = 0x7fff;
  rhs.data[2] = 0xffff;
  res.data[2] = 0x7fff;
  rhs.data[3] = 0x8000;
  res.data[3] = 0xffff;
  rhs.data[4] = 0x8000;
  res.data[4] = 0;
  rhs.data[5] = 0xffff;
  res.data[5] = 0x8001;
  rhs.data[6] = 0;
  res.data[6] = 0x7fff;
  rhs.data[7] = 0x8001;
  res.data[7] = 0xffff;
  res.data[8] = 0x8000;
  rhs.data[0x3c] = 0xc;
  rhs.data[0x3d] = 0;
  rhs.data[0x3e] = 0;
  rhs.data[0x3f] = 0;
  res.data[0x3c] = 0xd;
  res.data[0x3d] = 0;
  res.data[0x3e] = 0;
  res.data[0x3f] = 0;
  lhs_00 = _PDCLIB_bigint_sub((_PDCLIB_bigint_t *)&rhs.size,(_PDCLIB_bigint_t *)&res.size);
  iVar1 = _PDCLIB_bigint_cmp(lhs_00,(_PDCLIB_bigint_t *)&LRG);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_sub.c, line %d - %s\n"
           ,0x6b,"_PDCLIB_bigint_cmp( _PDCLIB_bigint_sub( &lhs, &rhs ), &res ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t lhs, rhs, res;
    _PDCLIB_bigint_digit_t NUL = 0;
    _PDCLIB_bigint_digit_t SML = _PDCLIB_BIGINT_DIGIT_MAX / 2;
    _PDCLIB_bigint_digit_t MID = _PDCLIB_BIGINT_DIGIT_MAX / 2 + 1;
    _PDCLIB_bigint_digit_t LRG = _PDCLIB_BIGINT_DIGIT_MAX / 2 + 2;
    _PDCLIB_bigint_digit_t MAX = _PDCLIB_BIGINT_DIGIT_MAX;

    /* Building a large number substraction that covers all kinds of
       cases. From rightmost digit to left:
    */
    /* carry 0, lhs '9', rhs '5', newcarry 0, result '4' */
    lhs.data[0] = MAX; rhs.data[0] = MID; res.data[0] = SML;
    /* carry 0, lhs '0', rhs '0', newcarry 0, result '0' */
    lhs.data[1] = NUL; rhs.data[1] = NUL; res.data[1] = NUL;
    /* carry 0, lhs '0', rhs '6', newcarry 1, result '4' */
    lhs.data[2] = NUL; rhs.data[2] = LRG; res.data[2] = SML;
    /* carry 1, lhs '0', rhs '0', newcarry 1, result '9' */
    lhs.data[3] = NUL; rhs.data[3] = NUL; res.data[3] = MAX;
    /* carry 1, lhs '0', rhs '9', newcarry 1, result '0' */
    lhs.data[4] = NUL; rhs.data[4] = MAX; res.data[4] = NUL;
    /* carry 1, lhs '0', rhs '5', newcarry 1, result '4' */
    lhs.data[5] = NUL; rhs.data[5] = MID; res.data[5] = SML;
    /* carry 1, lhs '4', rhs '9', newcarry 1, result '4' */
    lhs.data[6] = SML; rhs.data[6] = MAX; res.data[6] = SML;
    /* carry 1, lhs '5', rhs '5', newcarry 1, result '9' */
    lhs.data[7] = MID; rhs.data[7] = MID; res.data[7] = MAX;
    /* carry 1, lhs '6', rhs '5', newcarry 0, result '0' */
    lhs.data[8] = LRG; rhs.data[8] = MID; res.data[8] = NUL;
    /* carry 0, lhs '5', rhs '9', newcarry 1, result '6' */
    lhs.data[9] = MID; rhs.data[9] = MAX; res.data[9] = LRG;
    /* carry 1, lhs '5', rhs '0', newcarry 0, result '4' */
    lhs.data[10] = MID; rhs.data[10] = NUL; res.data[10] = SML;
    /* carry 0, lhs '5', rhs '6', newcarry 1, result '9' */
    lhs.data[11] = MID; rhs.data[11] = LRG; res.data[11] = MAX;
    /* carry 1, lhs '6', rhs ---, newcarry 0, result '5' */
    lhs.data[12] = LRG; res.data[12] = MID;
    lhs.size = 13; rhs.size = 12; res.size = 13;
    TESTCASE( _PDCLIB_bigint_cmp( _PDCLIB_bigint_sub( &lhs, &rhs ), &res ) == 0 );
#endif
    return TEST_RESULTS;
}